

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

CTransactionRef __thiscall wallet::anon_unknown_5::WalletImpl::getTx(WalletImpl *this,uint256 *txid)

{
  iterator iVar1;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  CTransactionRef CVar2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,
             (AnnotatedMixin<std::recursive_mutex> *)
             (*(long *)((txid->super_base_blob<256U>).m_data._M_elems + 0x10) + 0x1e8),
             "m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x14d,false);
  iVar1 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(*(long *)((txid->super_base_blob<256U>).m_data._M_elems + 0x10) + 0x248),in_RDX
                );
  if (iVar1.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
      (__node_type *)0x0) {
    (this->super_Wallet)._vptr_Wallet = (_func_int **)0x0;
    this->m_context = (WalletContext *)0x0;
  }
  else {
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                      _M_cur + 0x1c0));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    CVar2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)CVar2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

CTransactionRef getTx(const uint256& txid) override
    {
        LOCK(m_wallet->cs_wallet);
        auto mi = m_wallet->mapWallet.find(txid);
        if (mi != m_wallet->mapWallet.end()) {
            return mi->second.tx;
        }
        return {};
    }